

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_PrintMulti1(Dtt_Man_t *p)

{
  int iVar1;
  int Entry1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  long lVar5;
  int Entry2;
  uint uVar6;
  ulong in_RSI;
  int iVar7;
  
  uVar6 = 0;
  while( true ) {
    if (uVar6 == 0x10) {
      return;
    }
    p_00 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    for (lVar5 = 0; lVar5 < p->nClasses; lVar5 = lVar5 + 1) {
      if (p->pNodes[lVar5] == uVar6) {
        in_RSI = (ulong)(uint)p->pTimes[lVar5];
        Vec_IntPush(p_00,p->pTimes[lVar5]);
      }
    }
    iVar1 = p_00->nSize;
    if (iVar1 == 0) break;
    Vec_IntSort(p_00,(int)in_RSI);
    Entry1 = Vec_IntEntry(p_00,0);
    iVar7 = 1;
    Entry2 = 1;
    while( true ) {
      if (iVar1 <= iVar7) break;
      iVar2 = Vec_IntEntry(p_00,iVar7);
      if (Entry1 == iVar2) {
        Entry2 = Entry2 + 1;
      }
      else {
        if (iVar2 <= Entry1) {
          __assert_fail("Prev < Entry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                        ,0x27f,"void Dtt_PrintMulti1(Dtt_Man_t *)");
        }
        Vec_IntPushTwo(p_01,Entry1,Entry2);
        Entry2 = 1;
        Entry1 = iVar2;
      }
      iVar7 = iVar7 + 1;
    }
    if (0 < Entry2) {
      Vec_IntPushTwo(p_01,Entry1,Entry2);
    }
    in_RSI = (ulong)uVar6;
    printf("n=%d : ");
    iVar1 = p_01->nSize;
    for (iVar7 = 1; iVar7 < iVar1; iVar7 = iVar7 + 2) {
      uVar3 = Vec_IntEntry(p_01,iVar7 + -1);
      uVar4 = Vec_IntEntry(p_01,iVar7);
      in_RSI = (ulong)uVar3;
      printf("%d=%d ",in_RSI,(ulong)uVar4);
    }
    putchar(10);
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    uVar6 = uVar6 + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Dtt_PrintMulti1( Dtt_Man_t * p )
{
    int i, n, Entry, Count, Prev;
    for ( n = 0; n < 16; n++ )
    {
        Vec_Int_t * vTimes = Vec_IntAlloc( 100 );
        Vec_Int_t * vUsed  = Vec_IntAlloc( 100 );
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                Vec_IntPush( vTimes, p->pTimes[i] );
        if ( Vec_IntSize(vTimes) == 0 )
        {
            Vec_IntFree(vTimes);
            Vec_IntFree(vUsed);
            break;
        }
        Vec_IntSort( vTimes, 0 );
        Count = 1;
        Prev = Vec_IntEntry( vTimes, 0 );
        Vec_IntForEachEntryStart( vTimes, Entry, i, 1 )
            if ( Prev == Entry )
                Count++;
            else
            {
                assert( Prev < Entry );
                Vec_IntPushTwo( vUsed, Prev, Count );
                Count = 1;
                Prev = Entry;
            }
        if ( Count > 0 )
            Vec_IntPushTwo( vUsed, Prev, Count );
        printf( "n=%d : ", n);
        Vec_IntForEachEntryDouble( vUsed, Prev, Entry, i )
            printf( "%d=%d ", Prev, Entry );
        printf( "\n" );
        Vec_IntFree( vTimes );
        Vec_IntFree( vUsed );
    }
}